

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O3

String * __thiscall
asl::Date::toString(String *__return_storage_ptr__,Date *this,Format fmt,bool utc)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  ulong uVar5;
  double dVar6;
  String local_a0;
  DateData local_84;
  String s;
  
  dVar1 = this->_t;
  if (NAN(dVar1)) {
    String::String(__return_storage_ptr__,"?");
    return __return_storage_ptr__;
  }
  dVar6 = 0.0;
  if (!utc) {
    dVar6 = localOffset(this);
  }
  calc(&local_84,dVar1 + dVar6);
  uVar3 = 1;
  if (1 < local_84.month) {
    uVar3 = local_84.month;
  }
  uVar5 = 0xc;
  if ((int)uVar3 < 0xc) {
    uVar5 = (ulong)uVar3;
  }
  s.field_2._space[0] = '\0';
  s._size = 0;
  s._len = 0;
  switch(fmt) {
  case LONG:
    String::f(&local_a0,"%04i-%02i-%02iT%02i:%02i:%02i",(ulong)(uint)local_84.year,uVar5,
              (ulong)(uint)local_84.day,(ulong)(uint)local_84.hours,(ulong)(uint)local_84.minutes,
              (ulong)(uint)local_84.seconds);
    uVar4 = local_a0.field_2._str;
    if (local_a0._size == 0) {
      uVar4 = &local_a0.field_2;
    }
    String::assign(&s,(char *)uVar4,local_a0._len);
    break;
  case SHORT:
    String::String(&local_a0,0xf,"%04i%02i%02iT%02i%02i%02i",(ulong)(uint)local_84.year,uVar5,
                   (ulong)(uint)local_84.day,(ulong)(uint)local_84.hours,
                   (ulong)(uint)local_84.minutes,(ulong)(uint)local_84.seconds);
    uVar4 = local_a0.field_2._str;
    if (local_a0._size == 0) {
      uVar4 = &local_a0.field_2;
    }
    String::assign(&s,(char *)uVar4,local_a0._len);
    break;
  case DATE_ONLY:
    String::String(&local_a0,0xc,"%04i-%02i-%02i",(ulong)(uint)local_84.year,uVar5,
                   (ulong)(uint)local_84.day);
    uVar4 = local_a0.field_2._str;
    if (local_a0._size == 0) {
      uVar4 = &local_a0.field_2;
    }
    String::assign(&s,(char *)uVar4,local_a0._len);
    break;
  case HTTP:
    String::f(__return_storage_ptr__,"%s, %02i %s %04i %02i:%02i:%02i GMT",
              &DAT_00140ef0 + *(int *)(&DAT_00140ef0 + (long)local_84.weekDay * 4),
              (ulong)(uint)local_84.day,
              &DAT_00140f0c + *(int *)(&DAT_00140f0c + (ulong)((int)uVar5 - 1) * 4),
              (ulong)(uint)local_84.year,(ulong)(uint)local_84.hours,(ulong)(uint)local_84.minutes,
              (ulong)(uint)local_84.seconds);
    goto LAB_001382b6;
  case FULL:
    dVar1 = this->_t;
    dVar6 = floor(dVar1);
    String::f(&local_a0,"%04i-%02i-%02iT%02i:%02i:%02i.%03i",(ulong)(uint)local_84.year,uVar5,
              (ulong)(uint)local_84.day,(ulong)(uint)local_84.hours,(ulong)(uint)local_84.minutes,
              (ulong)(uint)local_84.seconds,
              (ulong)(uint)((int)((dVar1 - dVar6) * 1000.0 + 0.5) % 1000));
    uVar4 = local_a0.field_2._str;
    if (local_a0._size == 0) {
      uVar4 = &local_a0.field_2;
    }
    String::assign(&s,(char *)uVar4,local_a0._len);
    break;
  default:
    goto switchD_0013800c_default;
  }
  if (local_a0._size != 0) {
    free(local_a0.field_2._str);
  }
switchD_0013800c_default:
  if (utc) {
    String::operator+=(&s,'Z');
  }
  iVar2 = s._len;
  String::alloc(__return_storage_ptr__,s._len);
  __return_storage_ptr__->_len = iVar2;
  if (__return_storage_ptr__->_size == 0) {
    __dest = &__return_storage_ptr__->field_2;
  }
  else {
    __dest = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
  }
  if (s._size == 0) {
    __src = &s.field_2;
  }
  else {
    __src = (anon_union_16_2_78e7fdac_for_String_2 *)CONCAT71(s.field_2._1_7_,s.field_2._space[0]);
  }
  memcpy(__dest,__src,(long)iVar2 + 1);
LAB_001382b6:
  if (s._size != 0) {
    free((void *)CONCAT71(s.field_2._1_7_,s.field_2._space[0]));
  }
  return __return_storage_ptr__;
}

Assistant:

String Date::toString(Date::Format fmt, bool utc) const
{
	if (_t != _t)
		return "?";
	DateData d = calc(_t + (utc ? 0 : localOffset()));
	d.month = clamp(d.month, 1, 12);
	String   s;
	switch (fmt)
	{
	case LONG:
		s = String::f("%04i-%02i-%02iT%02i:%02i:%02i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds);
		break;
	case FULL:
		s = String::f("%04i-%02i-%02iT%02i:%02i:%02i.%03i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds,
		              int(1000 * fract(_t) + 0.5) % 1000);
		break;
	case SHORT:
		s = String(15, "%04i%02i%02iT%02i%02i%02i", d.year, d.month, d.day, d.hours, d.minutes, d.seconds);
		break;
	case DATE_ONLY:
		s = String(12, "%04i-%02i-%02i", d.year, d.month, d.day);
		break;
	case HTTP:
	{
		const char* wd[] = { "Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat" };
		const char* mn[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
		return String::f("%s, %02i %s %04i %02i:%02i:%02i GMT", wd[d.weekDay], d.day, mn[d.month - 1], d.year, d.hours, d.minutes,
		                 d.seconds);
	}
	}

	if (utc)
		s += 'Z';

	return s;
}